

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawElementsBaseVertexTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::BuiltInVariableGroup::init
          (BuiltInVariableGroup *this,EVP_PKEY_CTX *ctx)

{
  DrawMethod DVar1;
  int iVar2;
  int extraout_EAX;
  TestCase *this_00;
  undefined4 extraout_var;
  
  this_00 = (TestCase *)operator_new(0x98);
  DVar1 = this->m_method;
  gles31::TestCase::TestCase
            (this_00,(this->super_TestCaseGroup).m_context,"vertex_id","gl_VertexID Test");
  (this_00->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__VertexIDCase_01e61d40;
  iVar2 = (*this_00->m_context->m_renderCtx->_vptr_RenderContext[3])();
  this_00[1].super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)CONCAT44(extraout_var,iVar2);
  *(undefined4 *)&this_00[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  this_00[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  this_00[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  *(DrawMethod *)((long)&this_00[1].super_TestCase.super_TestNode.m_name._M_string_length + 4) =
       DVar1;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  return extraout_EAX;
}

Assistant:

void BuiltInVariableGroup::init (void)
{
	addChild(new VertexIDCase(m_context, m_method));
}